

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sup.c
# Opt level: O0

void suprsrv(supcxdef *sup,_func_void_bifcxdef_ptr_int **bif,toktdef *tab,int max,int v1compat,
            char *new_do,int casefold)

{
  errcxdef *peVar1;
  undefined4 uVar2;
  uint uVar3;
  size_t sVar4;
  int in_ECX;
  undefined8 *in_RDX;
  int in_R8D;
  errcxdef *in_R9;
  int in_stack_00000008;
  char buf [40];
  char *kwname;
  int do_kw;
  supprdef *pr;
  int i;
  supbidef *p;
  supkwdef *kw;
  _func_void_bifcxdef_ptr_int *in_stack_ffffffffffffff58;
  undefined8 *puVar5;
  errcxdef *in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff6c;
  int iVar6;
  _func_void_bifcxdef_ptr_int **in_stack_ffffffffffffff70;
  code *pcVar7;
  undefined1 local_88 [52];
  int iVar8;
  int in_stack_ffffffffffffffb0;
  int styp;
  char *in_stack_ffffffffffffffb8;
  supprdef *txt;
  undefined4 in_stack_ffffffffffffffc0;
  int iVar9;
  supbidef *local_38;
  supkwdef *local_30;
  
  styp = 0;
  iVar9 = 0;
  for (local_38 = supbitab; local_38->supbinam != (char *)0x0; local_38 = local_38 + 1) {
    if (in_ECX <= iVar9) {
      errsigf(in_stack_ffffffffffffff60,(char *)in_stack_ffffffffffffff58,0);
    }
    supaddbi(in_stack_ffffffffffffff70,
             (toktdef *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),
             (char *)in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,0,0x124b00);
    iVar9 = iVar9 + 1;
  }
  for (local_30 = supkwtab; peVar1 = stack0xffffffffffffffa8, local_30->supkwnam != (char *)0x0;
      local_30 = local_30 + 1) {
    if (*local_30->supkwnam == '\x02') {
      if (in_R8D != 0) break;
    }
    else {
      if ((styp == 0) || (unique0x1000039e = in_R9, in_R9 == (errcxdef *)0x0)) {
        unique0x00012000 = (errcxdef *)local_30->supkwnam;
      }
      if (*local_30->supkwnam == '\x01') {
        styp = 1;
      }
      else {
        styp = 0;
        if (in_stack_00000008 != 0) {
          strcpy(local_88,(char *)stack0xffffffffffffffa8);
          os_strlwr((char *)in_stack_ffffffffffffff60);
          unique0x00004e80 = (errcxdef *)local_88;
        }
        pcVar7 = (code *)*in_RDX;
        puVar5 = in_RDX;
        in_stack_ffffffffffffff60 = stack0xffffffffffffffa8;
        sVar4 = strlen((char *)stack0xffffffffffffffa8);
        uVar2 = (undefined4)sVar4;
        iVar6 = local_30->supkwtok;
        uVar3 = tokhsh((char *)stack0xffffffffffffffa8);
        (*pcVar7)(puVar5,in_stack_ffffffffffffff60,uVar2,0xb,iVar6,uVar3);
      }
    }
  }
  iVar8 = (int)((ulong)stack0xffffffffffffffa8 >> 0x20);
  iVar6 = iVar8;
  unique0x1000037e = peVar1;
  supaddsym((toktdef *)CONCAT44(iVar9,in_stack_ffffffffffffffc0),in_stack_ffffffffffffffb8,styp,
            in_stack_ffffffffffffffb0,iVar6);
  peVar1 = stack0xffffffffffffffa8;
  iVar8 = (int)((ulong)stack0xffffffffffffffa8 >> 0x20);
  iVar6 = iVar8;
  unique0x10000386 = peVar1;
  supaddsym((toktdef *)CONCAT44(iVar9,in_stack_ffffffffffffffc0),in_stack_ffffffffffffffb8,styp,
            in_stack_ffffffffffffffb0,iVar6);
  peVar1 = stack0xffffffffffffffa8;
  iVar8 = (int)((ulong)stack0xffffffffffffffa8 >> 0x20);
  iVar6 = iVar8;
  unique0x1000038e = peVar1;
  supaddsym((toktdef *)CONCAT44(iVar9,in_stack_ffffffffffffffc0),in_stack_ffffffffffffffb8,styp,
            in_stack_ffffffffffffffb0,iVar6);
  for (txt = supprtab; peVar1 = stack0xffffffffffffffa8, txt->supprnam != (char *)0x0; txt = txt + 1
      ) {
    iVar8 = (int)((ulong)stack0xffffffffffffffa8 >> 0x20);
    iVar6 = iVar8;
    unique0x10000396 = peVar1;
    supaddsym((toktdef *)CONCAT44(iVar9,in_stack_ffffffffffffffc0),(char *)txt,styp,
              in_stack_ffffffffffffffb0,iVar6);
  }
  return;
}

Assistant:

void suprsrv(supcxdef *sup, void (*bif[])(bifcxdef *, int),
             toktdef *tab, int max, int v1compat, char *new_do,
             int casefold)
{
    supkwdef *kw;
    supbidef *p;
    int       i;
    supprdef *pr;
    extern    supbidef osfar_t supbitab[];
    int       do_kw = FALSE;
    char     *kwname;
    char      buf[40];

    /* add built-in functions */
    for (p = supbitab, i = 0 ; p->supbinam ; ++i, ++p)
    {
        if (i >= max) errsig(sup->supcxerr, ERR_MANYBIF);
        supaddbi(bif, tab, p->supbinam, p->supbifn, i, casefold);
    }

    /* add keywords */
    for (kw = supkwtab ; kw->supkwnam ; ++kw)
    {
        if (kw->supkwnam[0] == '\002')
        {
            if (v1compat) break;               /* no v2 keywords - quit now */
            else continue;          /* keep going, but skip this flag entry */
        }
        
        /* if this is the "do" keyword, change to user-supplied value */
        if (do_kw && new_do)
            kwname = new_do;
        else
            kwname = kw->supkwnam;
        
        if (kw->supkwnam[0] == '\001')
        {
            do_kw = TRUE;
            continue;
        }
        else
            do_kw = FALSE;

        if (casefold)
        {
            strcpy(buf, kwname);
            os_strlwr(buf);
            kwname = buf;
        }
        (*tab->toktfadd)(tab, kwname, (int)strlen(kwname),
                         TOKSTKW, kw->supkwtok, tokhsh(kwname));
    }

    /* add pseudo-variables */
    supaddsym(tab, "self", TOKSTSELF, 0, casefold);
    supaddsym(tab, "inherited", TOKSTINHERIT, 0, casefold);
    supaddsym(tab, "argcount", TOKSTARGC, 0, casefold);
    
    /* add built-in properties */
    for (pr = supprtab ; pr->supprnam ; ++pr)
        supaddsym(tab, pr->supprnam, TOKSTPROP, pr->supprval, casefold);
}